

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_loopfilter_sse2.c
# Opt level: O2

void aom_highbd_lpf_horizontal_6_sse2
               (uint16_t *s,int p,uint8_t *_blimit,uint8_t *_limit,uint8_t *_thresh,int bd)

{
  longlong lVar1;
  longlong lVar2;
  longlong lVar3;
  longlong lVar4;
  longlong lVar5;
  longlong lVar6;
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  long lVar35;
  long lVar36;
  short sVar37;
  undefined4 uVar38;
  short sVar44;
  short sVar45;
  short sVar46;
  short sVar47;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  short sVar43;
  short sVar48;
  undefined1 auVar42 [16];
  short sVar49;
  short sVar54;
  short sVar55;
  short sVar56;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar57 [16];
  short sVar61;
  short sVar62;
  short sVar63;
  short sVar64;
  short sVar65;
  short sVar66;
  short sVar67;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  short sVar68;
  short sVar69;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  ushort uVar72;
  short sVar73;
  ushort uVar76;
  short sVar77;
  ushort uVar78;
  short sVar79;
  ushort uVar80;
  short sVar81;
  ushort uVar82;
  ushort uVar83;
  ushort uVar84;
  undefined1 auVar74 [16];
  ushort uVar85;
  undefined1 auVar75 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  short local_138;
  short sStack_136;
  short sStack_134;
  short sStack_132;
  short sStack_130;
  short sStack_12e;
  short sStack_12c;
  short sStack_12a;
  __m128i abs_p1p0;
  __m128i local_d8;
  __m128i local_c8;
  __m128i hev;
  __m128i mask;
  __m128i thresh;
  __m128i limit;
  __m128i blimit;
  __m128i pq [3];
  
  lVar35 = (long)(p * 2);
  lVar6 = *(longlong *)(s + lVar35);
  lVar36 = (long)p;
  lVar1 = *(longlong *)(s + -lVar36);
  lVar2 = *(longlong *)(s + lVar36);
  lVar3 = *(longlong *)(s + -lVar35);
  lVar4 = *(longlong *)(s + -(long)(p * 3));
  lVar5 = *(longlong *)s;
  auVar39 = *(undefined1 (*) [16])_blimit;
  auVar9[0xd] = 0;
  auVar9._0_13_ = auVar39._0_13_;
  auVar9[0xe] = auVar39[7];
  auVar12[0xc] = auVar39[6];
  auVar12._0_12_ = auVar39._0_12_;
  auVar12._13_2_ = auVar9._13_2_;
  auVar15[0xb] = 0;
  auVar15._0_11_ = auVar39._0_11_;
  auVar15._12_3_ = auVar12._12_3_;
  auVar18[10] = auVar39[5];
  auVar18._0_10_ = auVar39._0_10_;
  auVar18._11_4_ = auVar15._11_4_;
  auVar21[9] = 0;
  auVar21._0_9_ = auVar39._0_9_;
  auVar21._10_5_ = auVar18._10_5_;
  auVar24[8] = auVar39[4];
  auVar24._0_8_ = auVar39._0_8_;
  auVar24._9_6_ = auVar21._9_6_;
  auVar26._7_8_ = 0;
  auVar26._0_7_ = auVar24._8_7_;
  auVar29._1_8_ = SUB158(auVar26 << 0x40,7);
  auVar29[0] = auVar39[3];
  auVar29._9_6_ = 0;
  auVar30._1_10_ = SUB1510(auVar29 << 0x30,5);
  auVar30[0] = auVar39[2];
  auVar30._11_4_ = 0;
  auVar70._3_12_ = SUB1512(auVar30 << 0x20,3);
  auVar70[2] = auVar39[1];
  auVar70[0] = auVar39[0];
  auVar70[1] = 0;
  auVar70[0xf] = 0;
  auVar57 = ZEXT416(bd - 8);
  blimit = (__m128i)psllw(auVar70,auVar57);
  auVar39 = *(undefined1 (*) [16])_limit;
  auVar7[0xd] = 0;
  auVar7._0_13_ = auVar39._0_13_;
  auVar7[0xe] = auVar39[7];
  auVar10[0xc] = auVar39[6];
  auVar10._0_12_ = auVar39._0_12_;
  auVar10._13_2_ = auVar7._13_2_;
  auVar13[0xb] = 0;
  auVar13._0_11_ = auVar39._0_11_;
  auVar13._12_3_ = auVar10._12_3_;
  auVar16[10] = auVar39[5];
  auVar16._0_10_ = auVar39._0_10_;
  auVar16._11_4_ = auVar13._11_4_;
  auVar19[9] = 0;
  auVar19._0_9_ = auVar39._0_9_;
  auVar19._10_5_ = auVar16._10_5_;
  auVar22[8] = auVar39[4];
  auVar22._0_8_ = auVar39._0_8_;
  auVar22._9_6_ = auVar19._9_6_;
  auVar27._7_8_ = 0;
  auVar27._0_7_ = auVar22._8_7_;
  auVar31._1_8_ = SUB158(auVar27 << 0x40,7);
  auVar31[0] = auVar39[3];
  auVar31._9_6_ = 0;
  auVar32._1_10_ = SUB1510(auVar31 << 0x30,5);
  auVar32[0] = auVar39[2];
  auVar32._11_4_ = 0;
  auVar25[2] = auVar39[1];
  auVar25._0_2_ = auVar39._0_2_;
  auVar25._3_12_ = SUB1512(auVar32 << 0x20,3);
  auVar74._0_2_ = auVar39._0_2_ & 0xff;
  auVar74._2_13_ = auVar25._2_13_;
  auVar74[0xf] = 0;
  limit = (__m128i)psllw(auVar74,auVar57);
  auVar39 = *(undefined1 (*) [16])_thresh;
  auVar8[0xd] = 0;
  auVar8._0_13_ = auVar39._0_13_;
  auVar8[0xe] = auVar39[7];
  auVar11[0xc] = auVar39[6];
  auVar11._0_12_ = auVar39._0_12_;
  auVar11._13_2_ = auVar8._13_2_;
  auVar14[0xb] = 0;
  auVar14._0_11_ = auVar39._0_11_;
  auVar14._12_3_ = auVar11._12_3_;
  auVar17[10] = auVar39[5];
  auVar17._0_10_ = auVar39._0_10_;
  auVar17._11_4_ = auVar14._11_4_;
  auVar20[9] = 0;
  auVar20._0_9_ = auVar39._0_9_;
  auVar20._10_5_ = auVar17._10_5_;
  auVar23[8] = auVar39[4];
  auVar23._0_8_ = auVar39._0_8_;
  auVar23._9_6_ = auVar20._9_6_;
  auVar28._7_8_ = 0;
  auVar28._0_7_ = auVar23._8_7_;
  auVar33._1_8_ = SUB158(auVar28 << 0x40,7);
  auVar33[0] = auVar39[3];
  auVar33._9_6_ = 0;
  auVar34._1_10_ = SUB1510(auVar33 << 0x30,5);
  auVar34[0] = auVar39[2];
  auVar34._11_4_ = 0;
  auVar86._3_12_ = SUB1512(auVar34 << 0x20,3);
  auVar86[2] = auVar39[1];
  auVar86[0] = auVar39[0];
  auVar86[1] = 0;
  auVar86[0xf] = 0;
  thresh = (__m128i)psllw(auVar86,auVar57);
  auVar39 = ZEXT416((uint)(1 << ((char)bd - 1U & 0x1f)));
  auVar39 = pshuflw(auVar39,auVar39,0);
  uVar38 = auVar39._0_4_;
  pq[0][0] = lVar1;
  pq[0][1] = lVar5;
  pq[1][0] = lVar3;
  pq[1][1] = lVar2;
  pq[2][0] = lVar4;
  pq[2][1] = lVar6;
  highbd_hev_filter_mask_x_sse2
            (pq,3,&local_c8,&local_d8,&abs_p1p0,&limit,&blimit,&thresh,&hev,&mask);
  auVar39 = psllw(_DAT_00476bb0,ZEXT416((uint)bd));
  auVar50._8_4_ = 0xffffffff;
  auVar50._0_8_ = 0xffffffffffffffff;
  auVar50._12_4_ = 0xffffffff;
  auVar58 = paddsw(auVar39,auVar50);
  auVar39._4_4_ = uVar38;
  auVar39._0_4_ = uVar38;
  auVar39._8_4_ = uVar38;
  auVar39._12_4_ = uVar38;
  auVar58 = psubsw(auVar58,auVar39);
  auVar70 = psubsw((undefined1  [16])0x0,auVar39);
  auVar86 = psubsw((undefined1  [16])local_c8,auVar39);
  auVar40 = psubsw((undefined1  [16])local_d8,auVar39);
  auVar74 = psubsw(auVar86,auVar40);
  sVar55 = auVar58._0_2_;
  sVar43 = auVar74._0_2_;
  uVar72 = (ushort)(sVar55 < sVar43) * sVar55 | (ushort)(sVar55 >= sVar43) * sVar43;
  sVar56 = auVar58._2_2_;
  sVar43 = auVar74._2_2_;
  uVar76 = (ushort)(sVar56 < sVar43) * sVar56 | (ushort)(sVar56 >= sVar43) * sVar43;
  sVar61 = auVar58._4_2_;
  sVar43 = auVar74._4_2_;
  uVar78 = (ushort)(sVar61 < sVar43) * sVar61 | (ushort)(sVar61 >= sVar43) * sVar43;
  sVar62 = auVar58._6_2_;
  sVar43 = auVar74._6_2_;
  uVar80 = (ushort)(sVar62 < sVar43) * sVar62 | (ushort)(sVar62 >= sVar43) * sVar43;
  sVar63 = auVar58._8_2_;
  sVar43 = auVar74._8_2_;
  uVar82 = (ushort)(sVar63 < sVar43) * sVar63 | (ushort)(sVar63 >= sVar43) * sVar43;
  sVar64 = auVar58._10_2_;
  sVar43 = auVar74._10_2_;
  uVar83 = (ushort)(sVar64 < sVar43) * sVar64 | (ushort)(sVar64 >= sVar43) * sVar43;
  sVar65 = auVar58._12_2_;
  sVar43 = auVar74._12_2_;
  sVar44 = auVar74._14_2_;
  uVar84 = (ushort)(sVar65 < sVar43) * sVar65 | (ushort)(sVar65 >= sVar43) * sVar43;
  sVar66 = auVar58._14_2_;
  uVar85 = (ushort)(sVar66 < sVar44) * sVar66 | (ushort)(sVar66 >= sVar44) * sVar44;
  sVar43 = auVar70._0_2_;
  auVar75._0_2_ = (ushort)((short)uVar72 < sVar43) * sVar43 | ((short)uVar72 >= sVar43) * uVar72;
  sVar44 = auVar70._2_2_;
  auVar75._2_2_ = (ushort)((short)uVar76 < sVar44) * sVar44 | ((short)uVar76 >= sVar44) * uVar76;
  sVar45 = auVar70._4_2_;
  auVar75._4_2_ = (ushort)((short)uVar78 < sVar45) * sVar45 | ((short)uVar78 >= sVar45) * uVar78;
  sVar46 = auVar70._6_2_;
  auVar75._6_2_ = (ushort)((short)uVar80 < sVar46) * sVar46 | ((short)uVar80 >= sVar46) * uVar80;
  sVar47 = auVar70._8_2_;
  auVar75._8_2_ = (ushort)((short)uVar82 < sVar47) * sVar47 | ((short)uVar82 >= sVar47) * uVar82;
  sVar48 = auVar70._10_2_;
  auVar75._10_2_ = (ushort)((short)uVar83 < sVar48) * sVar48 | ((short)uVar83 >= sVar48) * uVar83;
  sVar49 = auVar70._12_2_;
  auVar75._12_2_ = (ushort)((short)uVar84 < sVar49) * sVar49 | ((short)uVar84 >= sVar49) * uVar84;
  sVar54 = auVar70._14_2_;
  auVar75._14_2_ = (ushort)((short)uVar85 < sVar54) * sVar54 | ((short)uVar85 >= sVar54) * uVar85;
  auVar58 = psubsw(auVar75 >> 0x40 & (undefined1  [16])hev,auVar75);
  auVar58 = psubsw(auVar58,auVar75);
  auVar58 = psubsw(auVar58,auVar75);
  sVar37 = auVar58._0_2_;
  uVar72 = (ushort)(sVar55 < sVar37) * sVar55 | (ushort)(sVar55 >= sVar37) * sVar37;
  sVar37 = auVar58._2_2_;
  uVar76 = (ushort)(sVar56 < sVar37) * sVar56 | (ushort)(sVar56 >= sVar37) * sVar37;
  sVar37 = auVar58._4_2_;
  uVar78 = (ushort)(sVar61 < sVar37) * sVar61 | (ushort)(sVar61 >= sVar37) * sVar37;
  sVar37 = auVar58._6_2_;
  uVar80 = (ushort)(sVar62 < sVar37) * sVar62 | (ushort)(sVar62 >= sVar37) * sVar37;
  sVar37 = auVar58._8_2_;
  uVar82 = (ushort)(sVar63 < sVar37) * sVar63 | (ushort)(sVar63 >= sVar37) * sVar37;
  sVar37 = auVar58._10_2_;
  uVar83 = (ushort)(sVar64 < sVar37) * sVar64 | (ushort)(sVar64 >= sVar37) * sVar37;
  sVar37 = auVar58._12_2_;
  sVar67 = auVar58._14_2_;
  uVar84 = (ushort)(sVar65 < sVar37) * sVar65 | (ushort)(sVar65 >= sVar37) * sVar37;
  uVar85 = (ushort)(sVar66 < sVar67) * sVar66 | (ushort)(sVar66 >= sVar67) * sVar67;
  auVar87._0_2_ = (ushort)((short)uVar72 < sVar43) * sVar43 | ((short)uVar72 >= sVar43) * uVar72;
  auVar87._2_2_ = (ushort)((short)uVar76 < sVar44) * sVar44 | ((short)uVar76 >= sVar44) * uVar76;
  auVar87._4_2_ = (ushort)((short)uVar78 < sVar45) * sVar45 | ((short)uVar78 >= sVar45) * uVar78;
  auVar87._6_2_ = (ushort)((short)uVar80 < sVar46) * sVar46 | ((short)uVar80 >= sVar46) * uVar80;
  auVar87._8_2_ = (ushort)((short)uVar82 < sVar47) * sVar47 | ((short)uVar82 >= sVar47) * uVar82;
  auVar87._10_2_ = (ushort)((short)uVar83 < sVar48) * sVar48 | ((short)uVar83 >= sVar48) * uVar83;
  auVar87._12_2_ = (ushort)((short)uVar84 < sVar49) * sVar49 | ((short)uVar84 >= sVar49) * uVar84;
  auVar87._14_2_ = (ushort)((short)uVar85 < sVar54) * sVar54 | ((short)uVar85 >= sVar54) * uVar85;
  auVar87 = auVar87 & (undefined1  [16])mask;
  auVar88._0_8_ = auVar87._0_8_;
  auVar88._8_4_ = auVar87._0_4_;
  auVar88._12_4_ = auVar87._4_4_;
  auVar58 = paddsw(auVar88,_DAT_00476bc0);
  sVar37 = auVar58._0_2_;
  uVar72 = (ushort)(sVar55 < sVar37) * sVar55 | (ushort)(sVar55 >= sVar37) * sVar37;
  sVar37 = auVar58._2_2_;
  uVar76 = (ushort)(sVar56 < sVar37) * sVar56 | (ushort)(sVar56 >= sVar37) * sVar37;
  sVar37 = auVar58._4_2_;
  uVar78 = (ushort)(sVar61 < sVar37) * sVar61 | (ushort)(sVar61 >= sVar37) * sVar37;
  sVar37 = auVar58._6_2_;
  uVar80 = (ushort)(sVar62 < sVar37) * sVar62 | (ushort)(sVar62 >= sVar37) * sVar37;
  sVar37 = auVar58._8_2_;
  uVar82 = (ushort)(sVar63 < sVar37) * sVar63 | (ushort)(sVar63 >= sVar37) * sVar37;
  sVar37 = auVar58._10_2_;
  uVar83 = (ushort)(sVar64 < sVar37) * sVar64 | (ushort)(sVar64 >= sVar37) * sVar37;
  sVar37 = auVar58._12_2_;
  sVar67 = auVar58._14_2_;
  uVar84 = (ushort)(sVar65 < sVar37) * sVar65 | (ushort)(sVar65 >= sVar37) * sVar37;
  uVar85 = (ushort)(sVar66 < sVar67) * sVar66 | (ushort)(sVar66 >= sVar67) * sVar67;
  auVar89._0_2_ = (ushort)((short)uVar72 < sVar43) * sVar43 | ((short)uVar72 >= sVar43) * uVar72;
  auVar89._2_2_ = (ushort)((short)uVar76 < sVar44) * sVar44 | ((short)uVar76 >= sVar44) * uVar76;
  auVar89._4_2_ = (ushort)((short)uVar78 < sVar45) * sVar45 | ((short)uVar78 >= sVar45) * uVar78;
  auVar89._6_2_ = (ushort)((short)uVar80 < sVar46) * sVar46 | ((short)uVar80 >= sVar46) * uVar80;
  auVar89._8_2_ = (ushort)((short)uVar82 < sVar47) * sVar47 | ((short)uVar82 >= sVar47) * uVar82;
  auVar89._10_2_ = (ushort)((short)uVar83 < sVar48) * sVar48 | ((short)uVar83 >= sVar48) * uVar83;
  auVar89._12_2_ = (ushort)((short)uVar84 < sVar49) * sVar49 | ((short)uVar84 >= sVar49) * uVar84;
  auVar89._14_2_ = (ushort)((short)uVar85 < sVar54) * sVar54 | ((short)uVar85 >= sVar54) * uVar85;
  auVar70 = psraw(auVar89,3);
  auVar91._0_2_ = auVar70._0_2_ + 1;
  auVar91._2_2_ = auVar70._2_2_ + 1;
  auVar91._4_2_ = auVar70._4_2_ + 1;
  auVar91._6_2_ = auVar70._6_2_ + 1;
  auVar91._8_2_ = auVar70._0_2_ + 1;
  auVar91._10_2_ = auVar70._2_2_ + 1;
  auVar91._12_2_ = auVar70._4_2_ + 1;
  auVar91._14_2_ = auVar70._6_2_ + 1;
  auVar74 = psraw(auVar91,1);
  auVar58._8_8_ = lVar6;
  auVar58._0_8_ = lVar4;
  auVar51._8_8_ = SUB168(~(undefined1  [16])hev & auVar74,8);
  auVar51._0_8_ = auVar70._8_8_;
  auVar90._8_8_ = SUB168(~(undefined1  [16])hev & auVar74,0);
  auVar90._0_8_ = auVar70._0_8_;
  auVar70 = psubsw(auVar40,auVar90);
  auVar40._8_8_ = lVar5;
  auVar40._0_8_ = lVar1;
  auVar74 = paddsw(auVar51,auVar86);
  sVar37 = auVar70._0_2_;
  uVar72 = (ushort)(sVar55 < sVar37) * sVar55 | (ushort)(sVar55 >= sVar37) * sVar37;
  sVar37 = auVar70._2_2_;
  uVar76 = (ushort)(sVar56 < sVar37) * sVar56 | (ushort)(sVar56 >= sVar37) * sVar37;
  sVar37 = auVar70._4_2_;
  uVar78 = (ushort)(sVar61 < sVar37) * sVar61 | (ushort)(sVar61 >= sVar37) * sVar37;
  sVar37 = auVar70._6_2_;
  uVar80 = (ushort)(sVar62 < sVar37) * sVar62 | (ushort)(sVar62 >= sVar37) * sVar37;
  sVar37 = auVar70._8_2_;
  uVar82 = (ushort)(sVar63 < sVar37) * sVar63 | (ushort)(sVar63 >= sVar37) * sVar37;
  sVar37 = auVar70._10_2_;
  uVar83 = (ushort)(sVar64 < sVar37) * sVar64 | (ushort)(sVar64 >= sVar37) * sVar37;
  sVar37 = auVar70._12_2_;
  sVar67 = auVar70._14_2_;
  uVar84 = (ushort)(sVar65 < sVar37) * sVar65 | (ushort)(sVar65 >= sVar37) * sVar37;
  uVar85 = (ushort)(sVar66 < sVar67) * sVar66 | (ushort)(sVar66 >= sVar67) * sVar67;
  auVar41._0_2_ = (ushort)((short)uVar72 < sVar43) * sVar43 | ((short)uVar72 >= sVar43) * uVar72;
  auVar41._2_2_ = (ushort)((short)uVar76 < sVar44) * sVar44 | ((short)uVar76 >= sVar44) * uVar76;
  auVar41._4_2_ = (ushort)((short)uVar78 < sVar45) * sVar45 | ((short)uVar78 >= sVar45) * uVar78;
  auVar41._6_2_ = (ushort)((short)uVar80 < sVar46) * sVar46 | ((short)uVar80 >= sVar46) * uVar80;
  auVar41._8_2_ = (ushort)((short)uVar82 < sVar47) * sVar47 | ((short)uVar82 >= sVar47) * uVar82;
  auVar41._10_2_ = (ushort)((short)uVar83 < sVar48) * sVar48 | ((short)uVar83 >= sVar48) * uVar83;
  auVar41._12_2_ = (ushort)((short)uVar84 < sVar49) * sVar49 | ((short)uVar84 >= sVar49) * uVar84;
  auVar41._14_2_ = (ushort)((short)uVar85 < sVar54) * sVar54 | ((short)uVar85 >= sVar54) * uVar85;
  sVar37 = auVar74._0_2_;
  uVar72 = (ushort)(sVar55 < sVar37) * sVar55 | (ushort)(sVar55 >= sVar37) * sVar37;
  sVar55 = auVar74._2_2_;
  uVar76 = (ushort)(sVar56 < sVar55) * sVar56 | (ushort)(sVar56 >= sVar55) * sVar55;
  sVar55 = auVar74._4_2_;
  uVar78 = (ushort)(sVar61 < sVar55) * sVar61 | (ushort)(sVar61 >= sVar55) * sVar55;
  sVar55 = auVar74._6_2_;
  uVar80 = (ushort)(sVar62 < sVar55) * sVar62 | (ushort)(sVar62 >= sVar55) * sVar55;
  sVar55 = auVar74._8_2_;
  uVar82 = (ushort)(sVar63 < sVar55) * sVar63 | (ushort)(sVar63 >= sVar55) * sVar55;
  sVar55 = auVar74._10_2_;
  uVar83 = (ushort)(sVar64 < sVar55) * sVar64 | (ushort)(sVar64 >= sVar55) * sVar55;
  sVar55 = auVar74._12_2_;
  sVar56 = auVar74._14_2_;
  uVar84 = (ushort)(sVar65 < sVar55) * sVar65 | (ushort)(sVar65 >= sVar55) * sVar55;
  uVar85 = (ushort)(sVar66 < sVar56) * sVar66 | (ushort)(sVar66 >= sVar56) * sVar56;
  auVar52._0_2_ = (ushort)((short)uVar72 < sVar43) * sVar43 | ((short)uVar72 >= sVar43) * uVar72;
  auVar52._2_2_ = (ushort)((short)uVar76 < sVar44) * sVar44 | ((short)uVar76 >= sVar44) * uVar76;
  auVar52._4_2_ = (ushort)((short)uVar78 < sVar45) * sVar45 | ((short)uVar78 >= sVar45) * uVar78;
  auVar52._6_2_ = (ushort)((short)uVar80 < sVar46) * sVar46 | ((short)uVar80 >= sVar46) * uVar80;
  auVar52._8_2_ = (ushort)((short)uVar82 < sVar47) * sVar47 | ((short)uVar82 >= sVar47) * uVar82;
  auVar52._10_2_ = (ushort)((short)uVar83 < sVar48) * sVar48 | ((short)uVar83 >= sVar48) * uVar83;
  auVar52._12_2_ = (ushort)((short)uVar84 < sVar49) * sVar49 | ((short)uVar84 >= sVar49) * uVar84;
  auVar52._14_2_ = (ushort)((short)uVar85 < sVar54) * sVar54 | ((short)uVar85 >= sVar54) * uVar85;
  auVar70 = paddsw(auVar41,auVar39);
  auVar39 = paddsw(auVar52,auVar39);
  auVar74 = psubusw(auVar58,auVar40);
  auVar58 = psubusw(auVar40,auVar58);
  auVar58 = auVar58 | auVar74;
  sVar43 = auVar58._0_2_;
  uVar72 = (ushort)(sVar43 < (short)abs_p1p0[0]) * (short)abs_p1p0[0] |
           (ushort)(sVar43 >= (short)abs_p1p0[0]) * sVar43;
  sVar43 = auVar58._2_2_;
  uVar76 = (ushort)(sVar43 < abs_p1p0[0]._2_2_) * abs_p1p0[0]._2_2_ |
           (ushort)(sVar43 >= abs_p1p0[0]._2_2_) * sVar43;
  sVar43 = auVar58._4_2_;
  uVar78 = (ushort)(sVar43 < abs_p1p0[0]._4_2_) * abs_p1p0[0]._4_2_ |
           (ushort)(sVar43 >= abs_p1p0[0]._4_2_) * sVar43;
  sVar43 = auVar58._6_2_;
  uVar80 = (ushort)(sVar43 < abs_p1p0[0]._6_2_) * abs_p1p0[0]._6_2_ |
           (ushort)(sVar43 >= abs_p1p0[0]._6_2_) * sVar43;
  sVar43 = auVar58._8_2_;
  uVar82 = (ushort)(sVar43 < (short)abs_p1p0[1]) * (short)abs_p1p0[1] |
           (ushort)(sVar43 >= (short)abs_p1p0[1]) * sVar43;
  sVar43 = auVar58._10_2_;
  uVar83 = (ushort)(sVar43 < abs_p1p0[1]._2_2_) * abs_p1p0[1]._2_2_ |
           (ushort)(sVar43 >= abs_p1p0[1]._2_2_) * sVar43;
  sVar43 = auVar58._12_2_;
  sVar44 = auVar58._14_2_;
  uVar84 = (ushort)(sVar43 < abs_p1p0[1]._4_2_) * abs_p1p0[1]._4_2_ |
           (ushort)(sVar43 >= abs_p1p0[1]._4_2_) * sVar43;
  uVar85 = (ushort)(sVar44 < abs_p1p0[1]._6_2_) * abs_p1p0[1]._6_2_ |
           (ushort)(sVar44 >= abs_p1p0[1]._6_2_) * sVar44;
  auVar58 = psllw(_DAT_00476bb0,auVar57);
  auVar59._0_2_ =
       ((short)uVar82 < (short)uVar72) * uVar72 | ((short)uVar82 >= (short)uVar72) * uVar82;
  auVar59._2_2_ =
       ((short)uVar83 < (short)uVar76) * uVar76 | ((short)uVar83 >= (short)uVar76) * uVar83;
  auVar59._4_2_ =
       ((short)uVar84 < (short)uVar78) * uVar78 | ((short)uVar84 >= (short)uVar78) * uVar84;
  auVar59._6_2_ =
       ((short)uVar85 < (short)uVar80) * uVar80 | ((short)uVar85 >= (short)uVar80) * uVar85;
  auVar59._8_2_ = (0 < (short)uVar82) * uVar82;
  auVar59._10_2_ = (0 < (short)uVar83) * uVar83;
  auVar59._12_2_ = (0 < (short)uVar84) * uVar84;
  auVar59._14_2_ = (0 < (short)uVar85) * uVar85;
  auVar58 = psubusw(auVar59,auVar58);
  auVar60._0_2_ = -(ushort)(auVar58._0_2_ == 0);
  auVar60._2_2_ = -(ushort)(auVar58._2_2_ == 0);
  auVar60._4_2_ = -(ushort)(auVar58._4_2_ == 0);
  auVar60._6_2_ = -(ushort)(auVar58._6_2_ == 0);
  auVar60._8_2_ = -(ushort)(auVar58._8_2_ == 0);
  auVar60._10_2_ = -(ushort)(auVar58._10_2_ == 0);
  auVar60._12_2_ = -(ushort)(auVar58._12_2_ == 0);
  auVar60._14_2_ = -(ushort)(auVar58._14_2_ == 0);
  auVar60 = auVar60 & (undefined1  [16])mask;
  auVar57._0_8_ = auVar60._0_8_;
  auVar57._8_4_ = auVar60._0_4_;
  auVar57._12_4_ = auVar60._4_4_;
  auVar71._0_2_ = -(ushort)(auVar60._0_2_ == 0);
  auVar71._2_2_ = -(ushort)(auVar60._2_2_ == 0);
  auVar71._4_2_ = -(ushort)(auVar60._4_2_ == 0);
  auVar71._6_2_ = -(ushort)(auVar60._6_2_ == 0);
  auVar71._8_2_ = -(ushort)(auVar60._0_2_ == 0);
  auVar71._10_2_ = -(ushort)(auVar60._2_2_ == 0);
  auVar71._12_2_ = -(ushort)(auVar60._4_2_ == 0);
  auVar71._14_2_ = -(ushort)(auVar60._6_2_ == 0);
  if ((ushort)((ushort)(SUB161(auVar71 >> 7,0) & 1) | (ushort)(SUB161(auVar71 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar71 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar71 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar71 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar71 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar71 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar71 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar71 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar71 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar71 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar71 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar71 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar71 >> 0x6f,0) & 1) << 0xd |
               (ushort)((byte)(auVar71._14_2_ >> 7) & 1) << 0xe | auVar71._14_2_ & 0x8000) != 0xffff
     ) {
    sVar61 = (short)((ulong)lVar1 >> 0x10);
    sVar62 = (short)((ulong)lVar1 >> 0x20);
    sVar63 = (short)((ulong)lVar1 >> 0x30);
    sVar65 = (short)((ulong)lVar5 >> 0x10);
    sVar37 = (short)((ulong)lVar5 >> 0x20);
    sVar68 = (short)((ulong)lVar5 >> 0x30);
    local_138 = (short)lVar3;
    sStack_136 = (short)((ulong)lVar3 >> 0x10);
    sStack_134 = (short)((ulong)lVar3 >> 0x20);
    sStack_132 = (short)((ulong)lVar3 >> 0x30);
    sStack_130 = (short)lVar2;
    sStack_12e = (short)((ulong)lVar2 >> 0x10);
    sStack_12c = (short)((ulong)lVar2 >> 0x20);
    sStack_12a = (short)((ulong)lVar2 >> 0x30);
    sVar64 = (short)lVar5 * 2 + sStack_130;
    sVar66 = sVar65 * 2 + sStack_12e;
    sVar67 = sVar37 * 2 + sStack_12c;
    sVar69 = sVar68 * 2 + sStack_12a;
    sVar43 = (short)((ulong)lVar4 >> 0x10);
    sVar44 = (short)((ulong)lVar4 >> 0x20);
    sVar45 = (short)((ulong)lVar4 >> 0x30);
    sVar46 = (short)((ulong)lVar6 >> 0x10);
    sVar47 = (short)((ulong)lVar6 >> 0x20);
    sVar48 = (short)((ulong)lVar6 >> 0x30);
    sVar73 = (short)lVar1 * 2 + local_138 + 4;
    sVar77 = sVar61 * 2 + sStack_136 + 4;
    sVar79 = sVar62 * 2 + sStack_134 + 4;
    sVar81 = sVar63 * 2 + sStack_132 + 4;
    sVar49 = sVar73 + (short)lVar4 + local_138;
    sVar54 = sVar77 + sVar43 + sStack_136;
    sVar55 = sVar79 + sVar44 + sStack_134;
    sVar56 = sVar81 + sVar45 + sStack_132;
    auVar53._0_2_ = (ushort)(sVar49 + sVar64) >> 3;
    auVar53._2_2_ = (ushort)(sVar54 + sVar66) >> 3;
    auVar53._4_2_ = (ushort)(sVar55 + sVar67) >> 3;
    auVar53._6_2_ = (ushort)(sVar56 + sVar69) >> 3;
    auVar53._8_2_ = (ushort)((short)lVar4 * 2 + (short)lVar5 + sVar49) >> 3;
    auVar53._10_2_ = (ushort)(sVar43 * 2 + sVar65 + sVar54) >> 3;
    auVar53._12_2_ = (ushort)(sVar44 * 2 + sVar37 + sVar55) >> 3;
    auVar53._14_2_ = (ushort)(sVar45 * 2 + sVar68 + sVar56) >> 3;
    uVar72 = (short)lVar6 + sStack_130 + sVar64 + sVar73;
    uVar76 = sVar46 + sStack_12e + sVar66 + sVar77;
    uVar78 = sVar47 + sStack_12c + sVar67 + sVar79;
    uVar80 = sVar48 + sStack_12a + sVar69 + sVar81;
    auVar42._0_2_ = uVar72 >> 3;
    auVar42._2_2_ = uVar76 >> 3;
    auVar42._4_2_ = uVar78 >> 3;
    auVar42._6_2_ = uVar80 >> 3;
    auVar42._8_2_ = (ushort)(((short)lVar6 * 2 - (local_138 + (short)lVar1)) + uVar72) >> 3;
    auVar42._10_2_ = (ushort)((sVar46 * 2 - (sStack_136 + sVar61)) + uVar76) >> 3;
    auVar42._12_2_ = (ushort)((sVar47 * 2 - (sStack_134 + sVar62)) + uVar78) >> 3;
    auVar42._14_2_ = (ushort)((sVar48 * 2 - (sStack_132 + sVar63)) + uVar80) >> 3;
    auVar70 = auVar42 & auVar57 | ~auVar57 & auVar70;
    auVar39 = auVar53 & auVar57 | ~auVar57 & auVar39;
  }
  *(long *)(s + -lVar35) = auVar39._8_8_;
  *(long *)(s + -lVar36) = auVar39._0_8_;
  *(long *)s = auVar70._0_8_;
  *(long *)(s + lVar36) = auVar70._8_8_;
  return;
}

Assistant:

void aom_highbd_lpf_horizontal_6_sse2(uint16_t *s, int p,
                                      const uint8_t *_blimit,
                                      const uint8_t *_limit,
                                      const uint8_t *_thresh, int bd) {
  __m128i p2, p1, p0, q0, q1, q2, p1p0_out, q1q0_out;

  p2 = _mm_loadl_epi64((__m128i *)(s - 3 * p));
  p1 = _mm_loadl_epi64((__m128i *)(s - 2 * p));
  p0 = _mm_loadl_epi64((__m128i *)(s - 1 * p));
  q0 = _mm_loadl_epi64((__m128i *)(s + 0 * p));
  q1 = _mm_loadl_epi64((__m128i *)(s + 1 * p));
  q2 = _mm_loadl_epi64((__m128i *)(s + 2 * p));

  highbd_lpf_internal_6_sse2(&p2, &p1, &p0, &q0, &q1, &q2, &p1p0_out, &q1q0_out,
                             _blimit, _limit, _thresh, bd);

  _mm_storel_epi64((__m128i *)(s - 2 * p), _mm_srli_si128(p1p0_out, 8));
  _mm_storel_epi64((__m128i *)(s - 1 * p), p1p0_out);
  _mm_storel_epi64((__m128i *)(s + 0 * p), q1q0_out);
  _mm_storel_epi64((__m128i *)(s + 1 * p), _mm_srli_si128(q1q0_out, 8));
}